

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMaj3.c
# Opt level: O0

int Maj3_ManFindFanin(Maj3_Man_t *p,int i,int *pFanins)

{
  int iVar1;
  int iVar2;
  int local_28;
  int local_24;
  int nFanins;
  int f;
  int *pFanins_local;
  int i_local;
  Maj3_Man_t *p_local;
  
  local_28 = 0;
  p->nLits[2] = 0;
  p->nLits[1] = 0;
  p->nLits[0] = 0;
  local_24 = 0;
  do {
    if (i <= local_24) {
      return local_28;
    }
    if (-1 < p->VarMarks[i][local_24]) {
      if (p->VarMarks[i][local_24] < 1) {
        __assert_fail("p->VarMarks[i][f] > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcMaj3.c"
                      ,0xb2,"int Maj3_ManFindFanin(Maj3_Man_t *, int, int *)");
      }
      if (p->VarMarks[i][local_24] == 1) {
        p->nLits[2] = p->nLits[2] + 1;
        pFanins[local_28] = local_24;
        local_28 = local_28 + 1;
      }
      else {
        iVar1 = bmcg_sat_solver_read_cex_varvalue(p->pSat,p->VarMarks[i][local_24]);
        if (iVar1 == 0) {
          iVar2 = Abc_Var2Lit(p->VarMarks[i][local_24],0);
          iVar1 = p->nLits[0];
          p->nLits[0] = iVar1 + 1;
          p->pLits[0][iVar1] = iVar2;
        }
        else {
          iVar2 = Abc_Var2Lit(p->VarMarks[i][local_24],1);
          iVar1 = p->nLits[1];
          p->nLits[1] = iVar1 + 1;
          p->nLits[(long)iVar1 + -0x20] = iVar2;
          pFanins[local_28] = local_24;
          local_28 = local_28 + 1;
        }
      }
    }
    local_24 = local_24 + 1;
  } while( true );
}

Assistant:

static inline int Maj3_ManFindFanin( Maj3_Man_t * p, int i, int * pFanins )
{
    int f, nFanins = 0;
    p->nLits[0] = p->nLits[1] = p->nLits[2] = 0;
    for ( f = 0; f < i; f++ )
    {
        if ( p->VarMarks[i][f] < 0 )
            continue;
        assert( p->VarMarks[i][f] > 0 );
        if ( p->VarMarks[i][f] == 1 ) // fixed
        {
            p->nLits[2]++;
            pFanins[nFanins++] = f;
        }
        else if ( bmcg_sat_solver_read_cex_varvalue(p->pSat, p->VarMarks[i][f]) ) // pos
        {
            p->pLits[1][p->nLits[1]++] = Abc_Var2Lit(p->VarMarks[i][f], 1);
            pFanins[nFanins++] = f;
        }
        else // neg
            p->pLits[0][p->nLits[0]++] = Abc_Var2Lit(p->VarMarks[i][f], 0);
    }
    return nFanins;
}